

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildFileGenerator::GetTargets
          (cmExportBuildFileGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets)

{
  const_iterator this_00;
  bool bVar1;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *pvVar2;
  reference ppcVar3;
  __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_28;
  __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_20;
  const_iterator tei;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *targets_local;
  cmExportBuildFileGenerator *this_local;
  
  tei._M_current = (cmTargetExport **)targets;
  if (this->ExportSet == (cmExportSet *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(targets,&this->Targets);
  }
  else {
    pvVar2 = cmExportSet::GetTargetExports(this->ExportSet);
    local_20._M_current =
         (cmTargetExport **)
         std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin(pvVar2);
    while( true ) {
      pvVar2 = cmExportSet::GetTargetExports(this->ExportSet);
      local_28._M_current =
           (cmTargetExport **)
           std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end(pvVar2);
      bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
      this_00 = tei;
      if (!bVar1) break;
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                ::operator*(&local_20);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00._M_current,&(*ppcVar3)->TargetName);
      __gnu_cxx::
      __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
      ::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::GetTargets(
  std::vector<std::string>& targets) const
{
  if (this->ExportSet) {
    for (std::vector<cmTargetExport*>::const_iterator tei =
           this->ExportSet->GetTargetExports()->begin();
         tei != this->ExportSet->GetTargetExports()->end(); ++tei) {
      targets.push_back((*tei)->TargetName);
    }
    return;
  }
  targets = this->Targets;
}